

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * CompileVmDereference(ExpressionContext *ctx,VmModule *module,ExprDereference *node)

{
  TypeBase *type;
  VmValue *pVVar1;
  TypeBase *pTVar2;
  uint in_R9D;
  
  pVVar1 = CompileVm(ctx,module,node->value);
  pTVar2 = node->value->type;
  if ((pTVar2 == (TypeBase *)0x0) || (pTVar2->typeID != 0x12)) {
    pTVar2 = (TypeBase *)0x0;
  }
  if (pTVar2 != (TypeBase *)0x0) {
    type = (node->super_ExprBase).type;
    if ((TypeBase *)pTVar2[1]._vptr_TypeBase == type) {
      pVVar1 = anon_unknown.dwarf_233176::CreateLoad
                         (ctx,module,(node->super_ExprBase).source,type,pVVar1,in_R9D);
      pVVar1 = anon_unknown.dwarf_233176::CheckType(ctx,&node->super_ExprBase,pVVar1);
      return pVVar1;
    }
    __assert_fail("refType->subType == node->type",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xbde,
                  "VmValue *CompileVmDereference(ExpressionContext &, VmModule *, ExprDereference *)"
                 );
  }
  __assert_fail("refType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0xbdd,
                "VmValue *CompileVmDereference(ExpressionContext &, VmModule *, ExprDereference *)")
  ;
}

Assistant:

VmValue* CompileVmDereference(ExpressionContext &ctx, VmModule *module, ExprDereference *node)
{
	VmValue *value = CompileVm(ctx, module, node->value);

	TypeRef *refType = getType<TypeRef>(node->value->type);

	(void)refType;
	assert(refType);
	assert(refType->subType == node->type);

	return CheckType(ctx, node, CreateLoad(ctx, module, node->source, node->type, value, 0));
}